

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool __thiscall ImGuiListClipper::Step(ImGuiListClipper *this)

{
  long lVar1;
  int *piVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImGuiWindow *pIVar7;
  void *pvVar8;
  ImGuiTable *table;
  void *pvVar9;
  long lVar10;
  ImGuiContext *pIVar11;
  ImGuiContext *pIVar12;
  uint uVar13;
  ImGuiContext *ctx;
  void *pvVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  bool *pbVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  bool bVar22;
  int iVar23;
  int i;
  long lVar24;
  undefined8 *puVar25;
  int iVar26;
  uint uVar27;
  ImGuiListClipperRange local_48;
  void *local_38;
  
  pIVar11 = GImGui;
  fVar3 = this->ItemsHeight;
  pIVar7 = GImGui->CurrentWindow;
  pvVar8 = this->TempData;
  table = GImGui->CurrentTable;
  if ((table != (ImGuiTable *)0x0) && (table->IsInsideRow == true)) {
    ImGui::TableEndRow(table);
  }
  pIVar12 = GImGui;
  uVar13 = this->ItemsCount;
  if (uVar13 != 0) {
    if (GImGui->CurrentTable == (ImGuiTable *)0x0) {
      pbVar18 = &GImGui->CurrentWindow->SkipItems;
    }
    else {
      pbVar18 = &GImGui->CurrentTable->HostSkipItems;
    }
    if (*pbVar18 == false) {
      bVar22 = *(int *)((long)pvVar8 + 0xc) == 0;
      if ((bVar22 && table != (ImGuiTable *)0x0) && (table->IsUnfrozenRows == false)) {
        iVar17 = *(int *)((long)pvVar8 + 0x10);
        this->DisplayStart = iVar17;
        uVar27 = *(int *)((long)pvVar8 + 0x10) + 1;
        if ((int)uVar13 <= (int)uVar27) {
          uVar27 = uVar13;
        }
        this->DisplayEnd = uVar27;
        bVar22 = true;
        if (iVar17 < (int)uVar27) {
          *(int *)((long)pvVar8 + 0x10) = *(int *)((long)pvVar8 + 0x10) + 1;
        }
        goto LAB_001e3430;
      }
      if ((*(int *)((long)pvVar8 + 0xc) != 0) ||
         (this->StartPosY = (pIVar7->DC).CursorPos.y, 0.0 < this->ItemsHeight)) {
        if ((this->ItemsHeight <= 0.0) &&
           ((this->ItemsHeight =
                  ((pIVar7->DC).CursorPos.y - this->StartPosY) /
                  (float)(this->DisplayEnd - this->DisplayStart), 16777216.0 <= ABS(this->StartPosY)
            || (bVar22 = true, 16777216.0 <= ABS((pIVar7->DC).CursorPos.y))))) {
          this->ItemsHeight = (pIVar7->DC).PrevLineSize.y + (pIVar11->Style).ItemSpacing.y;
          bVar22 = true;
        }
        iVar17 = this->DisplayEnd;
        if (bVar22) {
          if (pIVar11->LogEnabled == true) {
            iVar23 = *(int *)((long)pvVar8 + 0x1c);
            if (*(int *)((long)pvVar8 + 0x18) == iVar23) {
              iVar26 = *(int *)((long)pvVar8 + 0x18) + 1;
              if (iVar23 == 0) {
                iVar20 = 8;
              }
              else {
                iVar20 = iVar23 / 2 + iVar23;
              }
              if (iVar26 < iVar20) {
                iVar26 = iVar20;
              }
              if (iVar23 < iVar26) {
                if (pIVar12 != (ImGuiContext *)0x0) {
                  piVar2 = &(pIVar12->IO).MetricsActiveAllocations;
                  *piVar2 = *piVar2 + 1;
                }
                pvVar14 = (*GImAllocatorAllocFunc)((long)iVar26 * 0xc,GImAllocatorUserData);
                if (*(void **)((long)pvVar8 + 0x20) != (void *)0x0) {
                  memcpy(pvVar14,*(void **)((long)pvVar8 + 0x20),
                         (long)*(int *)((long)pvVar8 + 0x18) * 0xc);
                  pvVar9 = *(void **)((long)pvVar8 + 0x20);
                  if ((pvVar9 != (void *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                    piVar2 = &(GImGui->IO).MetricsActiveAllocations;
                    *piVar2 = *piVar2 + -1;
                  }
                  (*GImAllocatorFreeFunc)(pvVar9,GImAllocatorUserData);
                }
                *(void **)((long)pvVar8 + 0x20) = pvVar14;
                *(int *)((long)pvVar8 + 0x1c) = iVar26;
              }
            }
            lVar15 = *(long *)((long)pvVar8 + 0x20);
            iVar23 = *(int *)((long)pvVar8 + 0x18);
            *(ulong *)(lVar15 + (long)iVar23 * 0xc) = (ulong)uVar13 << 0x20;
            *(undefined4 *)(lVar15 + 8 + (long)iVar23 * 0xc) = 0;
          }
          else {
            if ((pIVar11->NavMoveScoringItems == true) && (pIVar11->NavWindow != (ImGuiWindow *)0x0)
               ) {
              bVar22 = pIVar11->NavWindow->RootWindowForNav == pIVar7->RootWindowForNav;
            }
            else {
              bVar22 = false;
            }
            if (bVar22) {
              fVar4 = (pIVar11->NavScoringNoClipRect).Min.y;
              fVar5 = (pIVar11->NavScoringNoClipRect).Max.y;
              iVar23 = *(int *)((long)pvVar8 + 0x1c);
              if (*(int *)((long)pvVar8 + 0x18) == iVar23) {
                iVar26 = *(int *)((long)pvVar8 + 0x18) + 1;
                if (iVar23 == 0) {
                  iVar20 = 8;
                }
                else {
                  iVar20 = iVar23 / 2 + iVar23;
                }
                if (iVar26 < iVar20) {
                  iVar26 = iVar20;
                }
                if (iVar23 < iVar26) {
                  if (pIVar12 != (ImGuiContext *)0x0) {
                    piVar2 = &(pIVar12->IO).MetricsActiveAllocations;
                    *piVar2 = *piVar2 + 1;
                  }
                  pvVar14 = (*GImAllocatorAllocFunc)((long)iVar26 * 0xc,GImAllocatorUserData);
                  if (*(void **)((long)pvVar8 + 0x20) != (void *)0x0) {
                    local_38 = pvVar14;
                    memcpy(pvVar14,*(void **)((long)pvVar8 + 0x20),
                           (long)*(int *)((long)pvVar8 + 0x18) * 0xc);
                    pvVar14 = *(void **)((long)pvVar8 + 0x20);
                    if ((pvVar14 != (void *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                      piVar2 = &(GImGui->IO).MetricsActiveAllocations;
                      *piVar2 = *piVar2 + -1;
                    }
                    (*GImAllocatorFreeFunc)(pvVar14,GImAllocatorUserData);
                    pvVar14 = local_38;
                  }
                  *(void **)((long)pvVar8 + 0x20) = pvVar14;
                  *(int *)((long)pvVar8 + 0x1c) = iVar26;
                }
              }
              lVar15 = *(long *)((long)pvVar8 + 0x20);
              iVar23 = *(int *)((long)pvVar8 + 0x18);
              *(ulong *)(lVar15 + (long)iVar23 * 0xc) = CONCAT44((int)fVar5,(int)fVar4);
              *(undefined4 *)(lVar15 + 8 + (long)iVar23 * 0xc) = 1;
              *(int *)((long)pvVar8 + 0x18) = *(int *)((long)pvVar8 + 0x18) + 1;
              if (((pIVar11->NavMoveFlags & 0x400) != 0) && (pIVar11->NavTabbingDir == -1)) {
                local_48.Min = this->ItemsCount + -1;
                local_48.Max = this->ItemsCount;
                local_48.PosToIndexConvert = false;
                local_48.PosToIndexOffsetMin = '\0';
                local_48.PosToIndexOffsetMax = '\0';
                local_48._11_1_ = 0;
                ImVector<ImGuiListClipperRange>::push_back
                          ((ImVector<ImGuiListClipperRange> *)((long)pvVar8 + 0x18),&local_48);
              }
            }
            if ((pIVar11->NavId != 0) && (pIVar7->NavLastIds[0] == pIVar11->NavId)) {
              fVar4 = (pIVar7->DC).CursorStartPos.y;
              local_48.Min = (int)(pIVar7->NavRectRel[0].Min.y + fVar4);
              local_48.Max = (int)(fVar4 + pIVar7->NavRectRel[0].Max.y);
              local_48.PosToIndexConvert = true;
              local_48.PosToIndexOffsetMin = '\0';
              local_48.PosToIndexOffsetMax = '\0';
              local_48._11_1_ = 0;
              ImVector<ImGuiListClipperRange>::push_back
                        ((ImVector<ImGuiListClipperRange> *)((long)pvVar8 + 0x18),&local_48);
            }
            uVar13 = 1;
            if ((bVar22) && (uVar13 = 1, pIVar11->NavMoveClipDir == 2)) {
              uVar13 = 0xff01;
            }
            uVar27 = 0;
            if (bVar22) {
              uVar27 = (uint)(pIVar11->NavMoveClipDir == 3) << 0x10;
            }
            fVar4 = (pIVar7->ClipRect).Min.y;
            fVar5 = (pIVar7->ClipRect).Max.y;
            iVar23 = *(int *)((long)pvVar8 + 0x1c);
            if (*(int *)((long)pvVar8 + 0x18) == iVar23) {
              iVar26 = *(int *)((long)pvVar8 + 0x18) + 1;
              if (iVar23 == 0) {
                iVar20 = 8;
              }
              else {
                iVar20 = iVar23 / 2 + iVar23;
              }
              if (iVar26 < iVar20) {
                iVar26 = iVar20;
              }
              if (iVar23 < iVar26) {
                if (GImGui != (ImGuiContext *)0x0) {
                  piVar2 = &(GImGui->IO).MetricsActiveAllocations;
                  *piVar2 = *piVar2 + 1;
                }
                pvVar14 = (*GImAllocatorAllocFunc)((long)iVar26 * 0xc,GImAllocatorUserData);
                if (*(void **)((long)pvVar8 + 0x20) != (void *)0x0) {
                  local_38 = pvVar14;
                  memcpy(pvVar14,*(void **)((long)pvVar8 + 0x20),
                         (long)*(int *)((long)pvVar8 + 0x18) * 0xc);
                  pvVar14 = *(void **)((long)pvVar8 + 0x20);
                  if ((pvVar14 != (void *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                    piVar2 = &(GImGui->IO).MetricsActiveAllocations;
                    *piVar2 = *piVar2 + -1;
                  }
                  (*GImAllocatorFreeFunc)(pvVar14,GImAllocatorUserData);
                  pvVar14 = local_38;
                }
                *(void **)((long)pvVar8 + 0x20) = pvVar14;
                *(int *)((long)pvVar8 + 0x1c) = iVar26;
              }
            }
            lVar15 = *(long *)((long)pvVar8 + 0x20);
            iVar23 = *(int *)((long)pvVar8 + 0x18);
            *(ulong *)(lVar15 + (long)iVar23 * 0xc) = CONCAT44((int)fVar5,(int)fVar4);
            *(uint *)(lVar15 + 8 + (long)iVar23 * 0xc) = uVar27 | uVar13;
          }
          *(int *)((long)pvVar8 + 0x18) = *(int *)((long)pvVar8 + 0x18) + 1;
          iVar23 = *(int *)((long)pvVar8 + 0x18);
          if (0 < iVar23) {
            lVar15 = 8;
            lVar19 = 0;
            do {
              lVar24 = *(long *)((long)pvVar8 + 0x20);
              if (*(char *)(lVar24 + lVar15) == '\x01') {
                fVar4 = (pIVar7->DC).CursorPos.y;
                fVar5 = *(float *)((long)pvVar8 + 8);
                fVar6 = this->ItemsHeight;
                iVar26 = *(char *)(lVar24 + 1 + lVar15) + iVar17 +
                         (int)((((float)*(int *)(lVar24 + -8 + lVar15) - fVar4) - fVar5) / fVar6);
                iVar23 = this->ItemsCount + -1;
                if (iVar26 < iVar23) {
                  iVar23 = iVar26;
                }
                if (iVar26 < iVar17) {
                  iVar23 = iVar17;
                }
                *(int *)(lVar24 + -8 + lVar15) = iVar23;
                lVar10 = *(long *)((long)pvVar8 + 0x20);
                iVar20 = *(char *)(lVar10 + 2 + lVar15) + iVar17 +
                         (int)((((float)*(int *)(lVar24 + -4 + lVar15) - fVar4) - fVar5) / fVar6 +
                              0.999999);
                iVar23 = *(int *)(lVar10 + -8 + lVar15);
                iVar26 = this->ItemsCount;
                if (iVar20 < this->ItemsCount) {
                  iVar26 = iVar20;
                }
                if (iVar20 <= iVar23) {
                  iVar26 = iVar23 + 1;
                }
                *(int *)(lVar10 + -4 + lVar15) = iVar26;
                *(undefined1 *)(*(long *)((long)pvVar8 + 0x20) + lVar15) = 0;
              }
              lVar19 = lVar19 + 1;
              iVar23 = *(int *)((long)pvVar8 + 0x18);
              lVar15 = lVar15 + 0xc;
            } while (lVar19 < iVar23);
          }
          iVar26 = *(int *)((long)pvVar8 + 0xc);
          if (1 < iVar23 - iVar26) {
            lVar15 = (long)iVar26;
            uVar16 = (ulong)(uint)(iVar23 - iVar26);
            do {
              lVar19 = lVar15 * 0xc;
              lVar24 = lVar15;
              do {
                lVar10 = *(long *)((long)pvVar8 + 0x20);
                if (*(int *)(lVar10 + 0xc + lVar19) < *(int *)(lVar10 + lVar19)) {
                  lVar1 = lVar10 + lVar19;
                  puVar25 = (undefined8 *)(lVar10 + lVar19);
                  local_48._8_4_ = *(undefined4 *)(puVar25 + 1);
                  local_48._0_8_ = *puVar25;
                  *(undefined4 *)(puVar25 + 1) = *(undefined4 *)(lVar1 + 0x14);
                  *puVar25 = *(undefined8 *)(lVar1 + 0xc);
                  *(undefined4 *)(lVar1 + 0x14) = local_48._8_4_;
                  *(undefined8 *)(lVar1 + 0xc) = local_48._0_8_;
                }
                lVar24 = lVar24 + 1;
                lVar19 = lVar19 + 0xc;
              } while (lVar24 < (long)(uVar16 + lVar15 + -1));
              bVar22 = 2 < (long)uVar16;
              uVar16 = uVar16 - 1;
            } while (bVar22);
            while (iVar23 = iVar26, iVar26 = iVar23 + 1, iVar26 < *(int *)((long)pvVar8 + 0x18)) {
              lVar15 = *(long *)((long)pvVar8 + 0x20);
              lVar19 = (long)iVar23;
              uVar16 = (ulong)iVar26;
              iVar20 = *(int *)(lVar15 + uVar16 * 0xc);
              if (iVar20 <= *(int *)(lVar15 + 4 + lVar19 * 0xc)) {
                piVar2 = (int *)(lVar15 + lVar19 * 0xc);
                iVar26 = *piVar2;
                if (iVar26 < iVar20) {
                  iVar20 = iVar26;
                }
                *piVar2 = iVar20;
                lVar15 = *(long *)((long)pvVar8 + 0x20);
                iVar26 = *(int *)(lVar15 + 4 + lVar19 * 0xc);
                lVar24 = uVar16 * 0xc;
                iVar20 = *(int *)(lVar15 + 4 + lVar24);
                if (iVar20 < iVar26) {
                  iVar20 = iVar26;
                }
                *(int *)(lVar15 + 4 + lVar19 * 0xc) = iVar20;
                memmove((void *)(*(long *)((long)pvVar8 + 0x20) + lVar24),
                        (void *)(*(long *)((long)pvVar8 + 0x20) + lVar24 + 0xc),
                        (~uVar16 + (long)*(int *)((long)pvVar8 + 0x18)) * 0xc);
                *(int *)((long)pvVar8 + 0x18) = *(int *)((long)pvVar8 + 0x18) + -1;
                iVar26 = iVar23;
              }
            }
          }
        }
        if (*(int *)((long)pvVar8 + 0x18) <= *(int *)((long)pvVar8 + 0xc)) {
          if (this->ItemsCount != 0x7fffffff) {
            ImGuiListClipper_SeekCursorForItem(this,this->ItemsCount);
          }
          goto LAB_001e342e;
        }
        iVar23 = *(int *)(*(long *)((long)pvVar8 + 0x20) + (long)*(int *)((long)pvVar8 + 0xc) * 0xc)
        ;
        iVar26 = iVar17;
        if (iVar17 < iVar23) {
          iVar26 = iVar23;
        }
        this->DisplayStart = iVar26;
        iVar20 = *(int *)(*(long *)((long)pvVar8 + 0x20) + 4 +
                         (long)*(int *)((long)pvVar8 + 0xc) * 0xc);
        iVar21 = this->ItemsCount;
        if (iVar20 < this->ItemsCount) {
          iVar21 = iVar20;
        }
        this->DisplayEnd = iVar21;
        if (iVar17 < iVar23) {
          ImGuiListClipper_SeekCursorForItem(this,iVar26);
        }
        *(int *)((long)pvVar8 + 0xc) = *(int *)((long)pvVar8 + 0xc) + 1;
      }
      else {
        local_48.Max = *(int *)((long)pvVar8 + 0x10) + 1;
        local_48.Min = *(int *)((long)pvVar8 + 0x10);
        local_48.PosToIndexConvert = false;
        local_48.PosToIndexOffsetMin = '\0';
        local_48.PosToIndexOffsetMax = '\0';
        local_48._11_1_ = 0;
        ImVector<ImGuiListClipperRange>::push_front
                  ((ImVector<ImGuiListClipperRange> *)((long)pvVar8 + 0x18),&local_48);
        iVar17 = *(int *)((long)pvVar8 + 0x10);
        if (*(int *)((long)pvVar8 + 0x10) < **(int **)((long)pvVar8 + 0x20)) {
          iVar17 = **(int **)((long)pvVar8 + 0x20);
        }
        this->DisplayStart = iVar17;
        iVar17 = *(int *)(*(long *)((long)pvVar8 + 0x20) + 4);
        iVar23 = this->ItemsCount;
        if (iVar17 < this->ItemsCount) {
          iVar23 = iVar17;
        }
        this->DisplayEnd = iVar23;
        *(undefined4 *)((long)pvVar8 + 0xc) = 1;
      }
      bVar22 = true;
      goto LAB_001e3430;
    }
  }
LAB_001e342e:
  bVar22 = false;
LAB_001e3430:
  if (bVar22 != false) {
    bVar22 = (bool)(bVar22 & this->DisplayStart != this->DisplayEnd);
  }
  if (((pIVar11->CurrentTable != (ImGuiTable *)0x0) &&
      (pIVar11->CurrentTable->IsUnfrozenRows == false)) && ((pIVar11->DebugLogFlags & 0x10) != 0)) {
    ImGui::DebugLog("Clipper: Step(): inside frozen table row.\n");
  }
  if (((fVar3 <= 0.0) && (0.0 < this->ItemsHeight)) && ((pIVar11->DebugLogFlags & 0x10) != 0)) {
    ImGui::DebugLog("Clipper: Step(): computed ItemsHeight: %.2f.\n",(double)this->ItemsHeight);
  }
  if (bVar22 == false) {
    if ((pIVar11->DebugLogFlags & 0x10U) != 0) {
      ImGui::DebugLog("Clipper: Step(): End.\n");
    }
  }
  else if ((pIVar11->DebugLogFlags & 0x10U) != 0) {
    ImGui::DebugLog("Clipper: Step(): display %d to %d.\n",(ulong)(uint)this->DisplayStart,
                    (ulong)(uint)this->DisplayEnd);
  }
  if (bVar22 == false) {
    End(this);
  }
  return bVar22;
}

Assistant:

bool ImGuiListClipper::Step()
{
    ImGuiContext& g = *GImGui;
    bool need_items_height = (ItemsHeight <= 0.0f);
    bool ret = ImGuiListClipper_StepInternal(this);
    if (ret && (DisplayStart == DisplayEnd))
        ret = false;
    if (g.CurrentTable && g.CurrentTable->IsUnfrozenRows == false)
        IMGUI_DEBUG_LOG_CLIPPER("Clipper: Step(): inside frozen table row.\n");
    if (need_items_height && ItemsHeight > 0.0f)
        IMGUI_DEBUG_LOG_CLIPPER("Clipper: Step(): computed ItemsHeight: %.2f.\n", ItemsHeight);
    if (ret)
        IMGUI_DEBUG_LOG_CLIPPER("Clipper: Step(): display %d to %d.\n", DisplayStart, DisplayEnd);
    else
        IMGUI_DEBUG_LOG_CLIPPER("Clipper: Step(): End.\n");
    if (!ret)
        End();
    return ret;
}